

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

int Gia_SweeperFraig(Gia_Man_t *p,Vec_Int_t *vProbeIds,char *pCommLime,int nWords,int nConfs,
                    int fVerify,int fVerbose)

{
  int iVar1;
  int iLitNew;
  Abc_Frame_t *pAVar2;
  Vec_Int_t *p_00;
  int local_50;
  int i;
  int ProbeId;
  Vec_Int_t *vLits;
  Gia_Man_t *pNew;
  int fVerify_local;
  int nConfs_local;
  int nWords_local;
  char *pCommLime_local;
  Vec_Int_t *vProbeIds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_SweeperIsRunning(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_SweeperIsRunning(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x42e,
                  "int Gia_SweeperFraig(Gia_Man_t *, Vec_Int_t *, char *, int, int, int, int)");
  }
  vLits = (Vec_Int_t *)Gia_SweeperSweep(p,vProbeIds,nWords,nConfs,fVerify,fVerbose);
  if ((Gia_Man_t *)vLits == (Gia_Man_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    if (pCommLime != (char *)0x0) {
      pAVar2 = Abc_FrameGetGlobalFrame();
      Abc_FrameUpdateGia(pAVar2,(Gia_Man_t *)vLits);
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,pCommLime);
      pAVar2 = Abc_FrameGetGlobalFrame();
      vLits = (Vec_Int_t *)Abc_FrameGetGia(pAVar2);
    }
    p_00 = Gia_SweeperGraft(p,(Vec_Int_t *)0x0,(Gia_Man_t *)vLits);
    Gia_ManStop((Gia_Man_t *)vLits);
    for (local_50 = 0; iVar1 = Vec_IntSize(vProbeIds), local_50 < iVar1; local_50 = local_50 + 1) {
      iVar1 = Vec_IntEntry(vProbeIds,local_50);
      iLitNew = Vec_IntEntry(p_00,local_50);
      Gia_SweeperProbeUpdate(p,iVar1,iLitNew);
    }
    Vec_IntFree(p_00);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_SweeperFraig( Gia_Man_t * p, Vec_Int_t * vProbeIds, char * pCommLime, int nWords, int nConfs, int fVerify, int fVerbose )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vLits;
    int ProbeId, i;
    // sweeper is running
    assert( Gia_SweeperIsRunning(p) );
    // sweep the logic
    pNew = Gia_SweeperSweep( p, vProbeIds, nWords, nConfs, fVerify, fVerbose );
    if ( pNew == NULL )
        return 0;
    // execute command line
    if ( pCommLime )
    {
        // set pNew to be current GIA in ABC
        Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), pNew );
        // execute command line pCommLine using Abc_CmdCommandExecute()
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), pCommLime );
        // get pNew to be current GIA in ABC     
        pNew = Abc_FrameGetGia( Abc_FrameGetGlobalFrame() );
    }
    // return logic back into the main manager
    vLits = Gia_SweeperGraft( p, NULL, pNew );
    Gia_ManStop( pNew );
    // update the array of probes
    Vec_IntForEachEntry( vProbeIds, ProbeId, i )
        Gia_SweeperProbeUpdate( p, ProbeId, Vec_IntEntry(vLits, i) );
    Vec_IntFree( vLits );        
    return 1;
}